

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::SetEntryToDeferParseForDebugger(FunctionBody *this)

{
  Type *pTVar1;
  undefined1 *puVar2;
  ProxyEntryPointInfo *pPVar3;
  Type p_Var4;
  Attributes AVar5;
  int iVar6;
  undefined4 extraout_var;
  code *pcVar7;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  pPVar3 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr;
  p_Var4 = pPVar3->jsMethod;
  if (p_Var4 != ScriptContext::ProfileModeDeferredParsingThunk &&
      p_Var4 != JavascriptFunction::DeferredParsingThunk) {
    pcVar7 = JavascriptFunction::DeferredParsingThunk;
    if (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk ==
        ScriptContext::DebugProfileProbeThunk) {
      pcVar7 = ScriptContext::ProfileModeDeferredParsingThunk;
    }
    pPVar3->jsMethod = pcVar7;
    FunctionProxy::SetOriginalEntryPoint
              ((FunctionProxy *)this,JavascriptFunction::DeferredParsingThunk);
    AVar5 = FunctionProxy::GetAttributes((FunctionProxy *)this);
    FunctionProxy::SetAttributes((FunctionProxy *)this,AVar5 | DeferredParse);
  }
  pTVar1 = &(this->super_ParseableFunctionInfo).flags;
  *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|
                       Flags_HasOnlyThisStatements|Flags_NonUserCode|Flags_HasThis|Flags_HasTry|
                      Flags_HasOrParentHasArguments);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)5,decltype(nullptr)>
            ((FunctionProxy *)this,(void *)0x0);
  puVar2 = &(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *puVar2 = *puVar2 | 0x10;
  if (DAT_0145948a == '\x01') {
    iVar6 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
    Output::Trace(DebuggerPhase,
                  L"Regenerate Due To Debug Mode: function %s (%s) from script context %p\n",
                  CONCAT44(extraout_var,iVar6),(wchar (*) [42])local_78,
                  (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  }
  puVar2 = &(this->counters).field_0x1;
  *puVar2 = *puVar2 & 0xfe;
  return;
}

Assistant:

void FunctionBody::SetEntryToDeferParseForDebugger()
    {
        ProxyEntryPointInfo* defaultEntryPointInfo = this->GetDefaultEntryPointInfo();
        if (defaultEntryPointInfo->jsMethod != DefaultDeferredParsingThunk
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
            && defaultEntryPointInfo->jsMethod != ProfileDeferredParsingThunk
#endif
            )
        {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
            // Just change the thunk, the cleanup will be done once the function gets called.
            if (this->m_scriptContext->CurrentThunk == ProfileEntryThunk)
            {
                defaultEntryPointInfo->jsMethod = ProfileDeferredParsingThunk;
            }
            else
#endif
            {
                defaultEntryPointInfo->jsMethod = DefaultDeferredParsingThunk;
            }

            this->SetOriginalEntryPoint(DefaultDeferredParsingThunk);
            this->SetAttributes((FunctionInfo::Attributes) (this->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
        }

        // Set other state back to before parse as well
        this->SetStackNestedFunc(false);
        this->SetAuxPtr<AuxPointerType::StackNestedFuncParent>(nullptr);
        this->SetReparsed(true);
#if DBG
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Regenerate Due To Debug Mode: function %s (%s) from script context %p\n"),
            this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer), m_scriptContext);

        this->UnlockCounters(); // assuming background jit is stopped and allow the counter setters access again
#endif
    }